

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

archive_string * archive_string_ensure(archive_string *as,size_t s)

{
  ulong uVar1;
  char *pcVar2;
  int *piVar3;
  ulong uVar4;
  
  uVar1 = as->buffer_length;
  if (s <= uVar1 && as->s != (char *)0x0) {
    return as;
  }
  if (uVar1 < 0x20) {
    uVar4 = 0x20;
  }
  else if (uVar1 < 0x2000) {
    uVar4 = uVar1 * 2;
  }
  else {
    uVar4 = (uVar1 >> 2) + uVar1;
    if (CARRY8(uVar1 >> 2,uVar1)) goto LAB_001556ff;
  }
  if (s < uVar4) {
    s = uVar4;
  }
  pcVar2 = (char *)realloc(as->s,s);
  if (pcVar2 != (char *)0x0) {
    as->s = pcVar2;
    as->buffer_length = s;
    return as;
  }
LAB_001556ff:
  archive_string_free(as);
  piVar3 = __errno_location();
  *piVar3 = 0xc;
  return (archive_string *)0x0;
}

Assistant:

struct archive_string *
archive_string_ensure(struct archive_string *as, size_t s)
{
	char *p;
	size_t new_length;

	/* If buffer is already big enough, don't reallocate. */
	if (as->s && (s <= as->buffer_length))
		return (as);

	/*
	 * Growing the buffer at least exponentially ensures that
	 * append operations are always linear in the number of
	 * characters appended.  Using a smaller growth rate for
	 * larger buffers reduces memory waste somewhat at the cost of
	 * a larger constant factor.
	 */
	if (as->buffer_length < 32)
		/* Start with a minimum 32-character buffer. */
		new_length = 32;
	else if (as->buffer_length < 8192)
		/* Buffers under 8k are doubled for speed. */
		new_length = as->buffer_length + as->buffer_length;
	else {
		/* Buffers 8k and over grow by at least 25% each time. */
		new_length = as->buffer_length + as->buffer_length / 4;
		/* Be safe: If size wraps, fail. */
		if (new_length < as->buffer_length) {
			/* On failure, wipe the string and return NULL. */
			archive_string_free(as);
			errno = ENOMEM;/* Make sure errno has ENOMEM. */
			return (NULL);
		}
	}
	/*
	 * The computation above is a lower limit to how much we'll
	 * grow the buffer.  In any case, we have to grow it enough to
	 * hold the request.
	 */
	if (new_length < s)
		new_length = s;
	/* Now we can reallocate the buffer. */
	p = (char *)realloc(as->s, new_length);
	if (p == NULL) {
		/* On failure, wipe the string and return NULL. */
		archive_string_free(as);
		errno = ENOMEM;/* Make sure errno has ENOMEM. */
		return (NULL);
	}

	as->s = p;
	as->buffer_length = new_length;
	return (as);
}